

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

void MergeStyles(TidyDocImpl *doc,Node *node,Node *child)

{
  ctmbstr str;
  uint uVar1;
  uint uVar2;
  tmbstr s1;
  tmbstr ptVar3;
  AttVal *pAVar4;
  
  ptVar3 = (ctmbstr)0x0;
  for (pAVar4 = child->attributes; pAVar4 != (AttVal *)0x0; pAVar4 = pAVar4->next) {
    if ((pAVar4->dict != (Attribute *)0x0) && (pAVar4->dict->id == TidyAttr_CLASS)) {
      ptVar3 = pAVar4->value;
      break;
    }
  }
  for (pAVar4 = node->attributes; pAVar4 != (AttVal *)0x0; pAVar4 = pAVar4->next) {
    if ((pAVar4->dict != (Attribute *)0x0) && (pAVar4->dict->id == TidyAttr_CLASS)) {
      str = pAVar4->value;
      if (str != (ctmbstr)0x0) {
        if (ptVar3 != (ctmbstr)0x0) {
          uVar1 = prvTidytmbstrlen(str);
          uVar2 = prvTidytmbstrlen(ptVar3);
          s1 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,(long)uVar1 + (long)uVar2 + 2);
          prvTidytmbstrcpy(s1,str);
          s1[uVar1] = ' ';
          prvTidytmbstrcpy(s1 + uVar1 + 1,ptVar3);
          (*doc->allocator->vtbl->free)(doc->allocator,pAVar4->value);
          pAVar4->value = s1;
        }
        goto LAB_0013baf9;
      }
      break;
    }
  }
  if (ptVar3 != (ctmbstr)0x0) {
    pAVar4 = prvTidyNewAttributeEx(doc,"class",ptVar3,0x22);
    prvTidyInsertAttributeAtStart(node,pAVar4);
  }
LAB_0013baf9:
  ptVar3 = (ctmbstr)0x0;
  for (pAVar4 = child->attributes; pAVar4 != (AttVal *)0x0; pAVar4 = pAVar4->next) {
    if ((pAVar4->dict != (Attribute *)0x0) && (pAVar4->dict->id == TidyAttr_STYLE)) {
      ptVar3 = pAVar4->value;
      break;
    }
  }
  pAVar4 = node->attributes;
  do {
    if (pAVar4 == (AttVal *)0x0) {
LAB_0013bb6d:
      if (ptVar3 == (ctmbstr)0x0) {
        return;
      }
      pAVar4 = prvTidyNewAttributeEx(doc,"style",ptVar3,0x22);
      prvTidyInsertAttributeAtStart(node,pAVar4);
      return;
    }
    if ((pAVar4->dict != (Attribute *)0x0) && (pAVar4->dict->id == TidyAttr_STYLE)) {
      if (pAVar4->value != (ctmbstr)0x0) {
        if (ptVar3 == (ctmbstr)0x0) {
          return;
        }
        ptVar3 = MergeProperties(doc,pAVar4->value,ptVar3);
        (*doc->allocator->vtbl->free)(doc->allocator,pAVar4->value);
        pAVar4->value = ptVar3;
        return;
      }
      goto LAB_0013bb6d;
    }
    pAVar4 = pAVar4->next;
  } while( true );
}

Assistant:

static void MergeStyles(TidyDocImpl* doc, Node *node, Node *child)
{
    AttVal *av;
    tmbstr s1, s2, style;

    /*
       the child may have a class attribute used
       for attaching styles, if so the class name
       needs to be copied to node's class
    */
    MergeClasses(doc, node, child);

    for (s2 = NULL, av = child->attributes; av; av = av->next)
    {
        if (attrIsSTYLE(av))
        {
            s2 = av->value;
            break;
        }
    }

    for (s1 = NULL, av = node->attributes; av; av = av->next)
    {
        if (attrIsSTYLE(av))
        {
            s1 = av->value;
            break;
        }
    }

    if (s1)
    {
        if (s2)  /* merge styles from both */
        {
            style = MergeProperties(doc, s1, s2);
            TidyDocFree(doc, av->value);
            av->value = style;
        }
    }
    else if (s2)  /* copy style of child */
    {
        av = TY_(NewAttributeEx)( doc, "style", s2, '"' );
        TY_(InsertAttributeAtStart)( node, av );
    }
}